

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *out,QBitArray *ba)

{
  int iVar1;
  char *s;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  qsizetype len;
  quint64 in_stack_ffffffffffffffc8;
  QDataStream *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *pcVar2;
  
  s = (char *)QBitArray::size((QBitArray *)in_stack_ffffffffffffffd0);
  iVar1 = QDataStream::version(in_RDI);
  if (iVar1 < 0x14) {
    pcVar2 = s;
    iVar1 = std::numeric_limits<int>::max();
    if ((long)iVar1 < (long)s) {
      QDataStream::setStatus(in_RDI,SizeLimitExceeded);
      return in_RDI;
    }
    QDataStream::operator<<(in_stack_ffffffffffffffd0,(quint32)(in_stack_ffffffffffffffc8 >> 0x20));
    in_stack_ffffffffffffffd8 = s;
    s = pcVar2;
  }
  else {
    QDataStream::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (0 < (long)s) {
    QByteArray::data((QByteArray *)in_stack_ffffffffffffffd0);
    QByteArray::size((QByteArray *)in_RSI);
    QDataStream::writeRawData(in_RSI,s,(qint64)in_stack_ffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QBitArray &ba)
{
    const qsizetype len = ba.size();
    if (out.version() < QDataStream::Qt_6_0) {
        if (Q_UNLIKELY(len > qsizetype{(std::numeric_limits<qint32>::max)()})) {
            out.setStatus(QDataStream::Status::SizeLimitExceeded);
            return out;
        }
        out << quint32(len);
    } else {
        out << quint64(len);
    }
    if (len > 0)
        out.writeRawData(ba.d.data() + 1, ba.d.size() - 1);
    return out;
}